

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Reader::skipCommentTokens(Reader *this,Token *token)

{
  int *in_RSI;
  Token *in_RDI;
  Reader *unaff_retaddr;
  
  if ((in_RDI[0xb].type_ & tokenObjectBegin) == tokenEndOfStream) {
    readToken(unaff_retaddr,in_RDI);
  }
  else {
    do {
      readToken(unaff_retaddr,in_RDI);
    } while (*in_RSI == 0xc);
  }
  return;
}

Assistant:

void Reader::skipCommentTokens(Token& token) {
  if (features_.allowComments_) {
    do {
      readToken(token);
    } while (token.type_ == tokenComment);
  } else {
    readToken(token);
  }
}